

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileMtlImporter::getTexture(ObjFileMtlImporter *this)

{
  char *s1;
  aiString *paVar1;
  size_type sVar2;
  int iVar3;
  Logger *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  bool clamp;
  string texture;
  int local_54;
  aiString *local_50;
  bool local_41;
  string local_40;
  
  s1 = (this->m_DataIt)._M_current;
  iVar3 = ASSIMP_strincmp(s1,DiffuseTexture_abi_cxx11_,DAT_00832940);
  if (iVar3 == 0) {
    local_50 = &this->m_pModel->m_pCurrentMaterial->texture;
    local_54 = 0;
  }
  else {
    iVar3 = ASSIMP_strincmp(s1,AmbientTexture_abi_cxx11_,DAT_00832960);
    if (iVar3 == 0) {
      local_50 = &this->m_pModel->m_pCurrentMaterial->textureAmbient;
      local_54 = 2;
    }
    else {
      iVar3 = ASSIMP_strincmp(s1,SpecularTexture_abi_cxx11_,DAT_00832980);
      if (iVar3 == 0) {
        local_50 = &this->m_pModel->m_pCurrentMaterial->textureSpecular;
        local_54 = 1;
      }
      else {
        iVar3 = ASSIMP_strincmp(s1,DisplacementTexture1_abi_cxx11_,DAT_00832a80);
        if ((iVar3 == 0) ||
           (iVar3 = ASSIMP_strincmp(s1,DisplacementTexture2_abi_cxx11_,DAT_00832aa0), iVar3 == 0)) {
          local_50 = &this->m_pModel->m_pCurrentMaterial->textureDisp;
          local_54 = 0xf;
        }
        else {
          iVar3 = ASSIMP_strincmp(s1,OpacityTexture_abi_cxx11_,DAT_008329a0);
          if (iVar3 == 0) {
            local_50 = &this->m_pModel->m_pCurrentMaterial->textureOpacity;
            local_54 = 0xe;
          }
          else {
            iVar3 = ASSIMP_strincmp(s1,EmissiveTexture1_abi_cxx11_,DAT_008329c0);
            if ((iVar3 == 0) ||
               (iVar3 = ASSIMP_strincmp(s1,EmissiveTexture2_abi_cxx11_,DAT_008329e0), iVar3 == 0)) {
              local_50 = &this->m_pModel->m_pCurrentMaterial->textureEmissive;
              local_54 = 3;
            }
            else {
              iVar3 = ASSIMP_strincmp(s1,BumpTexture1_abi_cxx11_,DAT_00832a00);
              if ((iVar3 == 0) ||
                 (iVar3 = ASSIMP_strincmp(s1,BumpTexture2_abi_cxx11_,DAT_00832a20), iVar3 == 0)) {
                local_50 = &this->m_pModel->m_pCurrentMaterial->textureBump;
                local_54 = 4;
              }
              else {
                iVar3 = ASSIMP_strincmp(s1,NormalTexture_abi_cxx11_,DAT_00832a40);
                if (iVar3 == 0) {
                  local_50 = &this->m_pModel->m_pCurrentMaterial->textureNormal;
                  local_54 = 5;
                }
                else {
                  iVar3 = ASSIMP_strincmp(s1,ReflectionTexture_abi_cxx11_,DAT_00832a60);
                  if (iVar3 == 0) {
                    return;
                  }
                  iVar3 = ASSIMP_strincmp(s1,SpecularityTexture_abi_cxx11_,DAT_00832ac0);
                  if (iVar3 != 0) {
                    this_00 = DefaultLogger::get();
                    Logger::error(this_00,"OBJ/MTL: Encountered unknown texture type");
                    return;
                  }
                  local_50 = &this->m_pModel->m_pCurrentMaterial->textureSpecularity;
                  local_54 = 0xd;
                }
              }
            }
          }
        }
      }
    }
  }
  local_41 = false;
  getTextureOption(this,&local_41,&local_54,&local_50);
  this->m_pModel->m_pCurrentMaterial->clamp[local_54] = local_41;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  _Var4 = getName<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&local_40);
  sVar2 = local_40._M_string_length;
  paVar1 = local_50;
  (this->m_DataIt)._M_current = _Var4._M_current;
  if ((local_50 != (aiString *)0x0) && (local_40._M_string_length < 0x400)) {
    local_50->length = (ai_uint32)local_40._M_string_length;
    memcpy(local_50->data,local_40._M_dataplus._M_p,local_40._M_string_length);
    paVar1->data[sVar2] = '\0';
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void ObjFileMtlImporter::getTexture() {
    aiString *out( NULL );
    int clampIndex = -1;

    const char *pPtr( &(*m_DataIt) );
    if ( !ASSIMP_strincmp( pPtr, DiffuseTexture.c_str(), static_cast<unsigned int>(DiffuseTexture.size()) ) ) {
        // Diffuse texture
        out = & m_pModel->m_pCurrentMaterial->texture;
        clampIndex = ObjFile::Material::TextureDiffuseType;
    } else if ( !ASSIMP_strincmp( pPtr,AmbientTexture.c_str(), static_cast<unsigned int>(AmbientTexture.size()) ) ) {
        // Ambient texture
        out = & m_pModel->m_pCurrentMaterial->textureAmbient;
        clampIndex = ObjFile::Material::TextureAmbientType;
    } else if ( !ASSIMP_strincmp( pPtr, SpecularTexture.c_str(), static_cast<unsigned int>(SpecularTexture.size()) ) ) {
        // Specular texture
        out = & m_pModel->m_pCurrentMaterial->textureSpecular;
        clampIndex = ObjFile::Material::TextureSpecularType;
    } else if ( !ASSIMP_strincmp( pPtr, DisplacementTexture1.c_str(), static_cast<unsigned int>(DisplacementTexture1.size()) ) ||
                !ASSIMP_strincmp( pPtr, DisplacementTexture2.c_str(), static_cast<unsigned int>(DisplacementTexture2.size()) ) ) {
        // Displacement texture
        out = &m_pModel->m_pCurrentMaterial->textureDisp;
        clampIndex = ObjFile::Material::TextureDispType;
    } else if ( !ASSIMP_strincmp( pPtr, OpacityTexture.c_str(), static_cast<unsigned int>(OpacityTexture.size()) ) ) {
        // Opacity texture
        out = & m_pModel->m_pCurrentMaterial->textureOpacity;
        clampIndex = ObjFile::Material::TextureOpacityType;
    } else if ( !ASSIMP_strincmp( pPtr, EmissiveTexture1.c_str(), static_cast<unsigned int>(EmissiveTexture1.size()) ) ||
                !ASSIMP_strincmp( pPtr, EmissiveTexture2.c_str(), static_cast<unsigned int>(EmissiveTexture2.size()) ) ) {
        // Emissive texture
        out = & m_pModel->m_pCurrentMaterial->textureEmissive;
        clampIndex = ObjFile::Material::TextureEmissiveType;
    } else if ( !ASSIMP_strincmp( pPtr, BumpTexture1.c_str(), static_cast<unsigned int>(BumpTexture1.size()) ) ||
                !ASSIMP_strincmp( pPtr, BumpTexture2.c_str(), static_cast<unsigned int>(BumpTexture2.size()) ) ) {
        // Bump texture
        out = & m_pModel->m_pCurrentMaterial->textureBump;
        clampIndex = ObjFile::Material::TextureBumpType;
    } else if ( !ASSIMP_strincmp( pPtr,NormalTexture.c_str(), static_cast<unsigned int>(NormalTexture.size()) ) ) {
        // Normal map
        out = & m_pModel->m_pCurrentMaterial->textureNormal;
        clampIndex = ObjFile::Material::TextureNormalType;
    } else if( !ASSIMP_strincmp( pPtr, ReflectionTexture.c_str(), static_cast<unsigned int>(ReflectionTexture.size()) ) ) {
        // Reflection texture(s)
        //Do nothing here
        return;
    } else if ( !ASSIMP_strincmp( pPtr, SpecularityTexture.c_str(), static_cast<unsigned int>(SpecularityTexture.size()) ) ) {
        // Specularity scaling (glossiness)
        out = & m_pModel->m_pCurrentMaterial->textureSpecularity;
        clampIndex = ObjFile::Material::TextureSpecularityType;
    } else {
        ASSIMP_LOG_ERROR("OBJ/MTL: Encountered unknown texture type");
        return;
    }

    bool clamp = false;
    getTextureOption(clamp, clampIndex, out);
    m_pModel->m_pCurrentMaterial->clamp[clampIndex] = clamp;

    std::string texture;
    m_DataIt = getName<DataArrayIt>( m_DataIt, m_DataItEnd, texture );
    if ( NULL!=out ) {
        out->Set( texture );
    }
}